

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::AddressFormatData::AddressFormatData(AddressFormatData *this,string *default_format_name)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  char *__args_1;
  undefined **__args;
  
  p_Var1 = &(this->map_)._M_t._M_impl.super__Rb_tree_header;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->map_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->map_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = ::std::__cxx11::string::compare((char *)default_format_name);
  if (iVar2 == 0) {
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<char_const*const&,char_const*const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,&kNettype,(char **)&kNettypeMainnet);
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,&kPrefixP2pkh,(char (*) [3])0x5e8c40);
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,(char **)&kPrefixP2sh,(char (*) [3])0x6270bb);
    __args_1 = "bc";
  }
  else {
    iVar2 = ::std::__cxx11::string::compare((char *)default_format_name);
    if (iVar2 != 0) {
      iVar2 = ::std::__cxx11::string::compare((char *)default_format_name);
      if (iVar2 == 0) {
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const*const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kNettype,(char **)&kNettypeRegtest);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixP2pkh,(char (*) [3])"6f");
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,(char **)&kPrefixP2sh,(char (*) [3])"c4");
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[5]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixBech32Hrp,(char (*) [5])"bcrt");
        return;
      }
      iVar2 = ::std::__cxx11::string::compare((char *)default_format_name);
      if (iVar2 == 0) {
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const*const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kNettype,&kNettypeLiquidV1);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixP2pkh,(char (*) [3])0x5e65fd);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,(char **)&kPrefixP2sh,(char (*) [3])0x5e6245);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixBech32Hrp,(char (*) [3])0x5c1b86);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixBlindP2pkh,(char (*) [3])0x5597e2);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixBlindP2sh,(char (*) [3])0x5597e2);
        __args_1 = "lq";
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)default_format_name);
        if (iVar2 != 0) {
          return;
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const*const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kNettype,&kNettypeElementsRegtest);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixP2pkh,(char (*) [3])"eb");
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,(char **)&kPrefixP2sh,(char (*) [3])"4b");
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[4]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixBech32Hrp,(char (*) [4])0x5385d9);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixBlindP2pkh,(char (*) [3])0x6270b4);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this,&kPrefixBlindP2sh,(char (*) [3])0x6270b4);
        __args_1 = "el";
      }
      __args = &kPrefixBlindBech32Hrp;
      goto LAB_00344956;
    }
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<char_const*const&,char_const*const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,&kNettype,&kNettypeTestnet);
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,&kPrefixP2pkh,(char (*) [3])"6f");
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,(char **)&kPrefixP2sh,(char (*) [3])"c4");
    __args_1 = "tb";
  }
  __args = &kPrefixBech32Hrp;
LAB_00344956:
  ::std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<char_const*const&,char_const(&)[3]>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this,__args,(char (*) [3])__args_1);
  return;
}

Assistant:

AddressFormatData::AddressFormatData(const std::string& default_format_name)
    : map_() {
  if (default_format_name == kNettypeMainnet) {
    map_.emplace(kNettype, kNettypeMainnet);
    map_.emplace(kPrefixP2pkh, "00");
    map_.emplace(kPrefixP2sh, "05");
    map_.emplace(kPrefixBech32Hrp, "bc");
  } else if (default_format_name == kNettypeTestnet) {
    map_.emplace(kNettype, kNettypeTestnet);
    map_.emplace(kPrefixP2pkh, "6f");
    map_.emplace(kPrefixP2sh, "c4");
    map_.emplace(kPrefixBech32Hrp, "tb");
  } else if (default_format_name == kNettypeRegtest) {
    map_.emplace(kNettype, kNettypeRegtest);
    map_.emplace(kPrefixP2pkh, "6f");
    map_.emplace(kPrefixP2sh, "c4");
    map_.emplace(kPrefixBech32Hrp, "bcrt");
  } else {
#ifndef CFD_DISABLE_ELEMENTS
    if (default_format_name == kNettypeLiquidV1) {
      map_.emplace(kNettype, kNettypeLiquidV1);
      map_.emplace(kPrefixP2pkh, "39");
      map_.emplace(kPrefixP2sh, "27");
      map_.emplace(kPrefixBech32Hrp, "ex");
      map_.emplace(kPrefixBlindP2pkh, "0c");
      map_.emplace(kPrefixBlindP2sh, "0c");
      map_.emplace(kPrefixBlindBech32Hrp, "lq");
    } else if (default_format_name == kNettypeElementsRegtest) {
      map_.emplace(kNettype, kNettypeElementsRegtest);
      map_.emplace(kPrefixP2pkh, "eb");
      map_.emplace(kPrefixP2sh, "4b");
      map_.emplace(kPrefixBech32Hrp, "ert");
      map_.emplace(kPrefixBlindP2pkh, "04");
      map_.emplace(kPrefixBlindP2sh, "04");
      map_.emplace(kPrefixBlindBech32Hrp, "el");
    }
#endif
  }
}